

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O1

int htmlParseLookupCommentEnd(htmlParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  xmlChar *pxVar2;
  xmlChar *pxVar3;
  xmlChar *pxVar4;
  uint uVar5;
  int in_R8D;
  
  pxVar2 = ctxt->input->base;
  pxVar3 = ctxt->input->cur;
  uVar5 = htmlParseLookupSequence(ctxt,'-','-','\0',in_R8D);
  if (-1 < (int)uVar5) {
    do {
      pxVar4 = ctxt->input->cur;
      xVar1 = pxVar4[(ulong)uVar5 + 2];
      if (xVar1 == '!') {
        xVar1 = pxVar4[(ulong)uVar5 + 3];
      }
      if (xVar1 == '>') {
        return uVar5;
      }
      ctxt->checkIndex = (long)(int)(uVar5 + ((int)pxVar3 - (int)pxVar2) + 1);
      uVar5 = htmlParseLookupSequence(ctxt,'-','-','\0',in_R8D);
    } while (-1 < (int)uVar5);
  }
  return uVar5;
}

Assistant:

static int
htmlParseLookupCommentEnd(htmlParserCtxtPtr ctxt)
{
    int mark = 0;
    int cur = CUR_PTR - BASE_PTR;

    while (mark >= 0) {
	mark = htmlParseLookupSequence(ctxt, '-', '-', 0, 0);
	if ((mark < 0) ||
	    (NXT(mark+2) == '>') ||
	    ((NXT(mark+2) == '!') && (NXT(mark+3) == '>'))) {
	    return mark;
	}
	ctxt->checkIndex = cur + mark + 1;
    }
    return mark;
}